

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificTests.cc
# Opt level: O0

void avro::specific::testString(void)

{
  bool bVar1;
  string b;
  string n;
  basic_cstring<const_char> *in_stack_ffffffffffffff20;
  lazy_ostream *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff50;
  const_string *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  unit_test_log_t *in_stack_ffffffffffffff70;
  basic_cstring<const_char> local_68;
  string local_58 [55];
  allocator<char> local_21;
  basic_cstring<const_char> local_20 [2];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::~allocator(&local_21);
  encodeAndDecode<std::__cxx11::string>(in_stack_ffffffffffffff68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SpecificTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffff20);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff70,(const_string *)in_stack_ffffffffffffff68,
               (size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffff28,(char (*) [1])in_stack_ffffffffffffff20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffff50,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SpecificTests.cc"
               ,0x70);
    in_stack_ffffffffffffff28 = (lazy_ostream *)0x2a72e8;
    in_stack_ffffffffffffff20 = local_20;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&stack0xffffffffffffff60,&stack0xffffffffffffff50,0x86,1,2,local_58,"b");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2177de);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_20);
  return;
}

Assistant:

void testString()
{
    string n = "abc";
    string b = encodeAndDecode(n);
    BOOST_CHECK_EQUAL(b, n);
}